

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::ShortImplicationsGraph::resize(ShortImplicationsGraph *this,uint32 nodes)

{
  size_type sVar1;
  size_type sVar2;
  uint in_ESI;
  ImplicationList *in_RDI;
  size_type i;
  ImpLists temp;
  reference in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff4c;
  size_type n;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  *in_stack_ffffffffffffff50;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  local_70 [6];
  size_type local_c;
  
  local_c = in_ESI;
  sVar1 = bk_lib::
          pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
          ::size((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                  *)in_RDI);
  if (sVar1 < in_ESI) {
    sVar1 = bk_lib::
            pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
            ::capacity((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                        *)in_RDI);
    if (sVar1 < local_c) {
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::pod_vector((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                    *)in_RDI);
      ImplicationList::ImplicationList(in_stack_ffffffffffffff20);
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_RDI);
      ImplicationList::~ImplicationList(in_stack_ffffffffffffff20);
      sVar1 = 0;
      uVar3 = local_c;
      while (n = sVar1,
            sVar2 = bk_lib::
                    pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                    ::size((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                            *)in_RDI), sVar1 != sVar2) {
        in_stack_ffffffffffffff20 =
             bk_lib::
             pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
             ::operator[](local_70,n);
        in_stack_ffffffffffffff18 =
             bk_lib::
             pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
             ::operator[]((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                           *)in_RDI,n);
        ImplicationList::move
                  ((ImplicationList *)CONCAT44(in_stack_ffffffffffffff34,uVar3),
                   (ImplicationList *)CONCAT44(sVar2,sVar1));
        sVar1 = n + 1;
      }
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::swap((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
              *)in_stack_ffffffffffffff20,
             (pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
              *)in_stack_ffffffffffffff18);
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::~pod_vector((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                     *)0x1d025c);
    }
    else {
      ImplicationList::ImplicationList(in_stack_ffffffffffffff20);
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_RDI);
      ImplicationList::~ImplicationList(in_stack_ffffffffffffff20);
    }
  }
  else {
    while (sVar1 = bk_lib::
                   pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                   ::size((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                           *)in_RDI), sVar1 != local_c) {
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::back((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
              *)in_RDI);
      ImplicationList::clear(in_RDI,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::pop_back((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                  *)in_RDI);
    }
  }
  return;
}

Assistant:

void ShortImplicationsGraph::resize(uint32 nodes) {
	if (nodes <= graph_.size()) {
		while (graph_.size() != nodes) {
			graph_.back().clear(true);
			graph_.pop_back();
		}
	}
	else if (graph_.capacity() >= nodes) {
		graph_.resize(nodes);
	}
	else {
		ImpLists temp; temp.resize(nodes);
		for (ImpLists::size_type i = 0; i != graph_.size(); ++i) {
			temp[i].move(graph_[i]);
		}
		graph_.swap(temp);
	}
}